

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O2

lws * lws_adopt_descriptor_vhost1
                (lws_vhost *vh,lws_adoption_type type,char *vh_prot_name,lws *parent,void *opaque)

{
  int *piVar1;
  lws *wsi;
  lws_protocols *plVar2;
  int iVar3;
  
  if (parent == (lws *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)parent->tsi;
  }
  wsi = lws_create_new_server_wsi(vh,iVar3);
  if (wsi == (lws *)0x0) {
    return (lws *)0x0;
  }
  wsi->opaque_user_data = opaque;
  if (parent != (lws *)0x0) {
    wsi->parent = parent;
    wsi->sibling_list = parent->child_list;
    parent->child_list = wsi;
  }
  if (vh_prot_name != (char *)0x0) {
    plVar2 = lws_vhost_name_to_protocol(wsi->vhost,vh_prot_name);
    wsi->protocol = plVar2;
    if (plVar2 == (lws_protocols *)0x0) {
      _lws_log(1,"Protocol %s not enabled on vhost %s\n",vh_prot_name,wsi->vhost->name);
      goto LAB_001369af;
    }
    iVar3 = lws_ensure_user_space(wsi);
    if (iVar3 != 0) {
      _lws_log(4,"OOM trying to get user_space\n");
      goto LAB_001369af;
    }
  }
  iVar3 = lws_role_call_adoption_bind(wsi,type,vh_prot_name);
  if (iVar3 == 0) {
    lws_dll2_add_head(&wsi->vh_awaiting_socket,&wsi->vhost->vh_awaiting_socket_owner);
    return wsi;
  }
  _lws_log(1,"%s: no role for desc type 0x%x\n","lws_adopt_descriptor_vhost1",type);
LAB_001369af:
  _lws_log(4,"%s: exiting on bail\n","lws_adopt_descriptor_vhost1");
  if (parent != (lws *)0x0) {
    parent->child_list = wsi->sibling_list;
  }
  if (wsi->user_space != (void *)0x0) {
    lws_realloc(wsi->user_space,0,"lws_free");
  }
  piVar1 = &vh->context->count_wsi_allocated;
  *piVar1 = *piVar1 + -1;
  lws_vhost_unbind_wsi(wsi);
  lws_realloc(wsi,0,"lws_free");
  return (lws *)0x0;
}

Assistant:

static struct lws *
lws_adopt_descriptor_vhost1(struct lws_vhost *vh, lws_adoption_type type,
			    const char *vh_prot_name, struct lws *parent,
			    void *opaque)
{
	struct lws_context *context = vh->context;
	struct lws_context_per_thread *pt;
	struct lws *new_wsi;
	int n;

	/*
	 * Notice that in SMP case, the wsi may be being created on an
	 * entirely different pt / tsi for load balancing.  In that case as
	 * we initialize it, it may become "live" concurrently unexpectedly...
	 */

	n = -1;
	if (parent)
		n = parent->tsi;
	new_wsi = lws_create_new_server_wsi(vh, n);
	if (!new_wsi)
		return NULL;

	new_wsi->opaque_user_data = opaque;

	pt = &context->pt[(int)new_wsi->tsi];
	lws_stats_bump(pt, LWSSTATS_C_CONNECTIONS, 1);

	if (parent) {
		new_wsi->parent = parent;
		new_wsi->sibling_list = parent->child_list;
		parent->child_list = new_wsi;
	}

	if (vh_prot_name) {
		new_wsi->protocol = lws_vhost_name_to_protocol(new_wsi->vhost,
							       vh_prot_name);
		if (!new_wsi->protocol) {
			lwsl_err("Protocol %s not enabled on vhost %s\n",
				 vh_prot_name, new_wsi->vhost->name);
			goto bail;
		}
		if (lws_ensure_user_space(new_wsi)) {
		       lwsl_notice("OOM trying to get user_space\n");
			goto bail;
		}
	}

	if (lws_role_call_adoption_bind(new_wsi, type, vh_prot_name)) {
		lwsl_err("%s: no role for desc type 0x%x\n", __func__, type);
		goto bail;
	}

	/*
	 * he's an allocated wsi, but he's not on any fds list or child list,
	 * join him to the vhost's list of these kinds of incomplete wsi until
	 * he gets another identity (he may do async dns now...)
	 */
	lws_dll2_add_head(&new_wsi->vh_awaiting_socket,
			  &new_wsi->vhost->vh_awaiting_socket_owner);

	return new_wsi;

bail:
       lwsl_notice("%s: exiting on bail\n", __func__);
	if (parent)
		parent->child_list = new_wsi->sibling_list;
	if (new_wsi->user_space)
		lws_free(new_wsi->user_space);

	vh->context->count_wsi_allocated--;

	lws_vhost_unbind_wsi(new_wsi);
	lws_free(new_wsi);

	return NULL;
}